

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseConditionalSections(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  xmlChar *pxVar5;
  xmlParserInputPtr pxVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  xmlParserErrors code;
  long lVar10;
  ulong local_38;
  
  if (ctxt->disableSAX < 2) {
    pvVar8 = (void *)0x0;
    local_38 = 0;
    uVar9 = 0;
    do {
      pxVar6 = ctxt->input;
      pxVar5 = pxVar6->cur;
      if (*pxVar5 == '<') {
        if ((pxVar5[1] == '!') && (pxVar5[2] == '[')) {
          iVar2 = pxVar6->id;
          pxVar6->cur = pxVar5 + 3;
          pxVar6->col = pxVar6->col + 3;
          if (pxVar5[3] == '\0') {
            xmlParserGrow(ctxt);
          }
          xmlSkipBlankCharsPE(ctxt);
          pxVar6 = ctxt->input;
          pxVar5 = pxVar6->cur;
          if (*pxVar5 == 'I') {
            if (pxVar5[1] == 'G') {
              if (((pxVar5[2] == 'N') && (pxVar5[3] == 'O')) &&
                 ((pxVar5[4] == 'R' && (pxVar5[5] == 'E')))) {
                pxVar6->cur = pxVar5 + 6;
                pxVar6->col = pxVar6->col + 6;
                if (pxVar5[6] == '\0') {
                  xmlParserGrow(ctxt);
                }
                xmlSkipBlankCharsPE(ctxt);
                if (*ctxt->input->cur != '[') goto LAB_0013b32a;
                if (ctxt->input->id != iVar2) {
                  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,
                             XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                             "All markup of the conditional section is not in the same entity\n");
                }
                xmlNextChar(ctxt);
                if (ctxt->disableSAX < 2) {
                  lVar10 = 0;
                  do {
                    pxVar6 = ctxt->input;
                    pxVar5 = pxVar6->cur;
                    xVar1 = *pxVar5;
                    if (xVar1 == '<') {
                      if ((pxVar5[1] != '!') || (pxVar5[2] != '[')) goto LAB_0013b20d;
                      pxVar6->cur = pxVar5 + 3;
                      pxVar6->col = pxVar6->col + 3;
                      if (pxVar5[3] == '\0') {
                        xmlParserGrow(ctxt);
                      }
                      lVar10 = lVar10 + 1;
                      if (lVar10 == 0) goto LAB_0013b334;
                    }
                    else {
                      if (xVar1 == ']') {
                        if ((pxVar5[1] == ']') && (pxVar5[2] == '>')) {
                          pxVar6->cur = pxVar5 + 3;
                          pxVar6->col = pxVar6->col + 3;
                          if (pxVar5[3] == '\0') {
                            xmlParserGrow(ctxt);
                          }
                          if (lVar10 != 0) {
                            lVar10 = lVar10 + -1;
                            goto LAB_0013b215;
                          }
                          break;
                        }
                      }
                      else if (xVar1 == '\0') {
                        xmlFatalErr(ctxt,XML_ERR_CONDSEC_NOT_FINISHED,(char *)0x0);
                        goto LAB_0013b2ff;
                      }
LAB_0013b20d:
                      xmlNextChar(ctxt);
                    }
LAB_0013b215:
                  } while (ctxt->disableSAX < 2);
                }
                if (ctxt->input->id != iVar2) {
                  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,
                             XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                             "All markup of the conditional section is not in the same entity\n");
                }
                goto LAB_0013b080;
              }
            }
            else if ((((pxVar5[1] == 'N') && (pxVar5[2] == 'C')) && (pxVar5[3] == 'L')) &&
                    (((pxVar5[4] == 'U' && (pxVar5[5] == 'D')) && (pxVar5[6] == 'E')))) {
              pxVar6->cur = pxVar5 + 7;
              pxVar6->col = pxVar6->col + 7;
              if (pxVar5[7] == '\0') {
                xmlParserGrow(ctxt);
              }
              xmlSkipBlankCharsPE(ctxt);
              if (*ctxt->input->cur != '[') {
LAB_0013b32a:
                code = XML_ERR_CONDSEC_INVALID;
                goto LAB_0013b2f0;
              }
              if (ctxt->input->id != iVar2) {
                xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,
                           XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                           "All markup of the conditional section is not in the same entity\n");
              }
              xmlNextChar(ctxt);
              pvVar7 = pvVar8;
              if (local_38 <= uVar9) {
                uVar3 = (uint)local_38;
                if ((int)uVar3 < 1) {
                  local_38 = 4;
                }
                else {
                  if (999 < uVar3) {
                    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_RESOURCE_LIMIT,
                               XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                               "Maximum conditional section nesting depth exceeded\n");
                    break;
                  }
                  uVar4 = uVar3 + 1 >> 1;
                  local_38 = (ulong)(uVar4 + uVar3);
                  if (1000 - uVar4 < uVar3) {
                    local_38 = 1000;
                  }
                }
                pvVar7 = (*xmlRealloc)(pvVar8,local_38 * 4);
                if (pvVar7 == (void *)0x0) {
LAB_0013b334:
                  xmlCtxtErrMemory(ctxt);
                  break;
                }
              }
              *(int *)((long)pvVar7 + uVar9 * 4) = iVar2;
              uVar9 = uVar9 + 1;
              pvVar8 = pvVar7;
              goto LAB_0013b080;
            }
          }
          code = XML_ERR_CONDSEC_INVALID_KEYWORD;
LAB_0013b2f0:
          xmlFatalErr(ctxt,code,(char *)0x0);
          xmlHaltParser(ctxt);
          break;
        }
        if ((pxVar5[1] != '?') && (pxVar5[1] != '!')) goto LAB_0013b2de;
        xmlParseMarkupDecl(ctxt);
      }
      else {
        if ((((uVar9 == 0) || (*pxVar5 != ']')) || (pxVar5[1] != ']')) || (pxVar5[2] != '>')) {
LAB_0013b2de:
          code = XML_ERR_EXT_SUBSET_NOT_FINISHED;
          goto LAB_0013b2f0;
        }
        if (pxVar6->id != *(int *)((long)pvVar8 + uVar9 * 4 + -4)) {
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                     "All markup of the conditional section is not in the same entity\n");
          pxVar6 = ctxt->input;
          pxVar5 = pxVar6->cur;
        }
        pxVar6->cur = pxVar5 + 3;
        pxVar6->col = pxVar6->col + 3;
        uVar9 = uVar9 - 1;
        if (pxVar5[3] == '\0') {
          xmlParserGrow(ctxt);
        }
      }
LAB_0013b080:
      if (uVar9 == 0) break;
      xmlSkipBlankCharsPE(ctxt);
      pxVar6 = ctxt->input;
      uVar3 = pxVar6->flags;
      if ((uVar3 & 0x40) == 0) {
        xmlParserShrink(ctxt);
        pxVar6 = ctxt->input;
        uVar3 = pxVar6->flags;
      }
      if (((uVar3 & 0x40) == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
    } while (ctxt->disableSAX < 2);
  }
  else {
    pvVar8 = (void *)0x0;
  }
LAB_0013b2ff:
  (*xmlFree)(pvVar8);
  return;
}

Assistant:

static void
xmlParseConditionalSections(xmlParserCtxtPtr ctxt) {
    int *inputIds = NULL;
    size_t inputIdsSize = 0;
    size_t depth = 0;

    while (PARSER_STOPPED(ctxt) == 0) {
        if ((RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
            int id = ctxt->input->id;

            SKIP(3);
            SKIP_BLANKS_PE;

            if (CMP7(CUR_PTR, 'I', 'N', 'C', 'L', 'U', 'D', 'E')) {
                SKIP(7);
                SKIP_BLANKS_PE;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                if (inputIdsSize <= depth) {
                    int *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(inputIdsSize, sizeof(tmp[0]),
                                              4, 1000);
                    if (newSize < 0) {
                        xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                                       "Maximum conditional section nesting"
                                       " depth exceeded\n");
                        goto error;
                    }
                    tmp = xmlRealloc(inputIds, newSize * sizeof(tmp[0]));
                    if (tmp == NULL) {
                        xmlErrMemory(ctxt);
                        goto error;
                    }
                    inputIds = tmp;
                    inputIdsSize = newSize;
                }
                inputIds[depth] = id;
                depth++;
            } else if (CMP6(CUR_PTR, 'I', 'G', 'N', 'O', 'R', 'E')) {
                size_t ignoreDepth = 0;

                SKIP(6);
                SKIP_BLANKS_PE;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                while (PARSER_STOPPED(ctxt) == 0) {
                    if (RAW == 0) {
                        xmlFatalErr(ctxt, XML_ERR_CONDSEC_NOT_FINISHED, NULL);
                        goto error;
                    }
                    if ((RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
                        SKIP(3);
                        ignoreDepth++;
                        /* Check for integer overflow */
                        if (ignoreDepth == 0) {
                            xmlErrMemory(ctxt);
                            goto error;
                        }
                    } else if ((RAW == ']') && (NXT(1) == ']') &&
                               (NXT(2) == '>')) {
                        SKIP(3);
                        if (ignoreDepth == 0)
                            break;
                        ignoreDepth--;
                    } else {
                        NEXT;
                    }
                }

                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
            } else {
                xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID_KEYWORD, NULL);
                xmlHaltParser(ctxt);
                goto error;
            }
        } else if ((depth > 0) &&
                   (RAW == ']') && (NXT(1) == ']') && (NXT(2) == '>')) {
            depth--;
            if (ctxt->input->id != inputIds[depth]) {
                xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "All markup of the conditional section is not"
                               " in the same entity\n");
            }
            SKIP(3);
        } else if ((RAW == '<') && ((NXT(1) == '!') || (NXT(1) == '?'))) {
            xmlParseMarkupDecl(ctxt);
        } else {
            xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
            xmlHaltParser(ctxt);
            goto error;
        }

        if (depth == 0)
            break;

        SKIP_BLANKS_PE;
        SHRINK;
        GROW;
    }

error:
    xmlFree(inputIds);
}